

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRound.h
# Opt level: O3

void __thiscall
TimeRound<channel>::AddTimeRoundItemNode
          (TimeRound<channel> *this,SP_TimeRoundItemNode<channel> *time_round_item_node)

{
  pointer ppSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  SP_TimeRoundItemList<channel> *pSVar3;
  element_type *peVar4;
  int iVar5;
  Lock_Guard lock;
  Lock_Guard LStack_28;
  
  Lock_Guard::Lock_Guard(&LStack_28,&this->Mutex);
  if (time_round_item_node != (SP_TimeRoundItemNode<channel> *)0x0) {
    peVar4 = (time_round_item_node->Item).
             super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = peVar4->time_threod;
    if (iVar2 < 1) {
      this_00 = (time_round_item_node->Item).
                super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      operator_delete(time_round_item_node);
    }
    else {
      iVar5 = this->max_time;
      if (iVar5 <= iVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1",
                   0x4b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        iVar5 = this->max_time;
        iVar2 = iVar5 + -1;
        peVar4 = (time_round_item_node->Item).
                 super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      iVar5 = (iVar2 + this->cur_index) % iVar5;
      peVar4->index = iVar5;
      ppSVar1 = (this->TimeRoundVector).
                super__Vector_base<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = ppSVar1[iVar5];
      if (pSVar3 == (SP_TimeRoundItemList<channel> *)0x0) {
        pSVar3 = (SP_TimeRoundItemList<channel> *)operator_new(0x10);
        pSVar3->head = (SP_TimeRoundItemNode<channel> *)0x0;
        pSVar3->tail = (SP_TimeRoundItemNode<channel> *)0x0;
        ppSVar1[iVar5] = pSVar3;
        ppSVar1 = (this->TimeRoundVector).
                  super__Vector_base<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar1[iVar5]->head = time_round_item_node;
        pSVar3 = ppSVar1[iVar5];
      }
      else {
        if (pSVar3->head == (SP_TimeRoundItemNode<channel> *)0x0) {
          pSVar3->head = time_round_item_node;
        }
        else {
          pSVar3->tail->next = time_round_item_node;
          time_round_item_node->pre = ppSVar1[iVar5]->tail;
        }
        pSVar3 = ppSVar1[iVar5];
      }
      pSVar3->tail = time_round_item_node;
    }
  }
  Lock_Guard::~Lock_Guard(&LStack_28);
  return;
}

Assistant:

void AddTimeRoundItemNode(SP_TimeRoundItemNode<T>* time_round_item_node)
        {
            Lock_Guard lock(Mutex);
            if(time_round_item_node == nullptr)
            {
                return;
            }
            int time = time_round_item_node->Item->GetTimeThreod();
            if(time <= 0)
            {
                delete time_round_item_node;
                return;
            }
            if(time >= max_time)
            {
                cout<<"TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1"<<endl;
                time = max_time-1;
            }
            int index = (cur_index + time) % max_time;
            time_round_item_node->Item->SetIndex(index);

            if(TimeRoundVector[index] == nullptr)
            {
                TimeRoundVector[index] = new SP_TimeRoundItemList<T>();
                TimeRoundVector[index]->head = time_round_item_node;
                TimeRoundVector[index]->tail = time_round_item_node;
            }
            else
            {
                if(TimeRoundVector[index]->head != nullptr)
                {
                    TimeRoundVector[index]->tail->next = time_round_item_node;
                    time_round_item_node->pre = TimeRoundVector[index]->tail;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
                else
                {
                    TimeRoundVector[index]->head = time_round_item_node;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
            }
        }